

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jglp.cpp
# Opt level: O2

void __thiscall merlin::jglp::run(jglp *this)

{
  graph *this_00;
  pointer pmVar1;
  pointer puVar2;
  index *piVar3;
  long lVar4;
  variable VX_00;
  pointer pfVar5;
  int iVar6;
  ostream *poVar7;
  factor *rhs;
  undefined8 extraout_RAX;
  undefined4 extraout_var;
  findex fVar8;
  ulong uVar9;
  ulong *puVar10;
  size_type __n;
  my_set<unsigned_long> *this_01;
  size_t i;
  size_t i_1;
  long lVar11;
  index *piVar12;
  size_t i_2;
  ulong uVar13;
  pointer puVar14;
  double dVar15;
  value vVar16;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar17 [16];
  vector<merlin::factor,_std::allocator<merlin::factor>_> fin;
  vector<merlin::factor,_std::allocator<merlin::factor>_> ftmp;
  flist ids;
  variable VX;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> vin;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> Orig;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> New;
  vector<double,_std::allocator<double>_> Norm;
  vector<unsigned_long,_std::allocator<unsigned_long>_> alphas;
  factor F;
  factor local_a0;
  undefined8 *local_40;
  char *local_38;
  
  dVar15 = timeSystem();
  (this->super_algorithm).m_start_time = dVar15;
  (*(this->super_graphical_model)._vptr_graphical_model[0xf])(this);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            (&fin,&(this->m_gmo).m_factors);
  F._vptr_factor = (_func_int **)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&Norm,((long)(this->m_gmo).m_factors.
                          super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_gmo).m_factors.
                         super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl
                         .super__Vector_impl_data._M_start) / 0x60,(value_type_conflict2 *)&F,
             (allocator_type *)&local_a0);
  lVar11 = 0;
  for (uVar13 = 0;
      uVar13 < (ulong)(((long)(this->m_gmo).m_factors.
                              super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_gmo).m_factors.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar13 = uVar13 + 1)
  {
    vVar16 = factor::max((factor *)
                         ((long)&(fin.
                                  super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar11)
                        );
    factor::binaryOpIP<merlin::factor::binOpDivide>
              ((factor *)
               ((long)&(fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                        _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar11));
    dVar15 = ::log(vVar16);
    Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar13] = dVar15;
    this->m_logz = dVar15 + this->m_logz;
    lVar11 = lVar11 + 0x60;
  }
  vin.
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vin.
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vin.
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = 0;
  for (uVar13 = 0;
      pmVar1 = (this->m_gmo).m_vadj.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(this->m_gmo).m_vadj.
                             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1 >> 5);
      uVar13 = uVar13 + 1) {
    std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
    push_back(&vin,(value_type *)
                   ((long)&(pmVar1->super_my_vector<unsigned_long>).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar11));
    lVar11 = lVar11 + 0x20;
  }
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector(&Orig,((long)(this->m_gmo).m_factors.
                      super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_gmo).m_factors.
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x60,(allocator_type *)&F);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector(&New,((long)(this->m_gmo).m_factors.
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_gmo).m_factors.
                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x60,(allocator_type *)&F);
  F._vptr_factor = (_func_int **)0x0;
  while( true ) {
    if ((_func_int **)
        ((long)Orig.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)Orig.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) <= F._vptr_factor) break;
    my_set<unsigned_long>::operator|=
              (Orig.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)F._vptr_factor,(unsigned_long *)&F)
    ;
    F._vptr_factor = (_func_int **)((long)F._vptr_factor + 1);
  }
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  resize(&this->m_mini_buckets,
         (long)(this->m_gmo).m_vadj.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_gmo).m_vadj.
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5);
  poVar7 = std::operator<<((ostream *)&std::cout,"[JGLP] Initialize join graph ...");
  std::endl<char,std::char_traits<char>>(poVar7);
  puVar10 = (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_00 = &(this->super_graphical_model).super_graph;
  while( true ) {
    if (puVar10 ==
        (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    if (this->m_debug != false) {
      poVar7 = std::operator<<((ostream *)&std::cout,"  Eliminating variable ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    VX.m_label = *puVar10;
    dVar15 = (this->super_graphical_model).m_dims.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[VX.m_label];
    uVar13 = (ulong)dVar15;
    VX.m_states = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13;
    uVar13 = *puVar10;
    if ((uVar13 < (ulong)((long)vin.
                                super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vin.
                                super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
       (vin.
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar13].super_my_vector<unsigned_long>.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vin.
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar13].super_my_vector<unsigned_long>.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      my_set<unsigned_long>::my_set
                (&ids,vin.
                      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
      VX_00.m_states = VX.m_states;
      VX_00.m_label = VX.m_label;
      partition(this,VX_00,&fin,&vin,&Norm,&Orig,&New,&ids);
      __n = (long)ids.super_my_vector<unsigned_long>.
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)ids.super_my_vector<unsigned_long>.
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
      if (1 < __n) {
        std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                  (&ftmp,__n,(allocator_type *)&F);
        variable_set::variable_set
                  ((variable_set *)&alphas,
                   &fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [*ids.super_my_vector<unsigned_long>.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start].v_);
        for (uVar13 = 1;
            uVar13 < (ulong)((long)ids.super_my_vector<unsigned_long>.
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)ids.super_my_vector<unsigned_long>.
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar13 = uVar13 + 1) {
          variable_set::operator&=
                    ((variable_set *)&alphas,
                     &fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [ids.super_my_vector<unsigned_long>.
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13]].v_);
        }
        factor::factor(&F,(variable_set *)&alphas,0.0);
        lVar11 = 0;
        uVar13 = 0;
        while( true ) {
          uVar9 = (long)ids.super_my_vector<unsigned_long>.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)ids.super_my_vector<unsigned_long>.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
          if (uVar9 <= uVar13) break;
          factor::maxmarginal(&local_a0,
                              fin.
                              super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                              ids.super_my_vector<unsigned_long>.
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar13],
                              (variable_set *)&alphas);
          factor::log(&local_a0,__x);
          factor::operator=((factor *)
                            ((long)&(ftmp.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor +
                            lVar11),rhs);
          factor::~factor(&local_a0);
          factor::binaryOpIP<merlin::factor::binOpPlus>
                    (&F,(long)&(ftmp.
                                super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                                _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar11);
          uVar13 = uVar13 + 1;
          lVar11 = lVar11 + 0x60;
        }
        auVar17._8_4_ =
             (int)((long)ids.super_my_vector<unsigned_long>.
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ids.super_my_vector<unsigned_long>.
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x23);
        auVar17._0_8_ = uVar9;
        auVar17._12_4_ = 0x45300000;
        factor::binaryOpIP<merlin::factor::binOpTimes>
                  ((factor *)
                   (1.0 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0))),&F);
        lVar11 = 0;
        for (uVar13 = 0;
            uVar13 < (ulong)((long)ids.super_my_vector<unsigned_long>.
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)ids.super_my_vector<unsigned_long>.
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar13 = uVar13 + 1) {
          factor::binaryOp<merlin::factor::binOpMinus>
                    (&local_a0,&F,
                     (long)&(ftmp.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar11);
          factor::exp(&local_a0,__x_00);
          factor::binaryOpIP<merlin::factor::binOpTimes>
                    (fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl
                     .super__Vector_impl_data._M_start +
                     ids.super_my_vector<unsigned_long>.
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13],extraout_RAX);
          factor::~factor(&local_a0);
          lVar11 = lVar11 + 0x60;
        }
        factor::~factor(&F);
        variable_set::~variable_set((variable_set *)&alphas);
        std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&ftmp);
      }
      alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (puVar14 = ids.super_my_vector<unsigned_long>.
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar14 !=
          ids.super_my_vector<unsigned_long>.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar14 = puVar14 + 1) {
        ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
        iVar6 = (*(this->super_graphical_model)._vptr_graphical_model[2])
                          (this,fin.
                                super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                                _M_impl.super__Vector_impl_data._M_start + *puVar14);
        ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar6);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&alphas,(value_type_conflict1 *)&ftmp);
        my_set<unsigned_long>::operator|=
                  ((this->m_mini_buckets).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *puVar10,(unsigned_long *)&ftmp);
        pfVar5 = fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar8 = *puVar14;
        variable_set::variable_set((variable_set *)&local_a0,&VX);
        factor::max(&F,pfVar5 + fVar8,(variable_set *)&local_a0);
        factor::operator=(fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_start + *puVar14,&F);
        factor::~factor(&F);
        variable_set::~variable_set((variable_set *)&local_a0);
        factor::binaryOpIP<merlin::factor::binOpDivide>
                  ((this->super_graphical_model).m_factors.
                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (long)ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                   super__Vector_impl_data._M_start + *puVar14);
        vVar16 = factor::max(fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                             ._M_impl.super__Vector_impl_data._M_start + *puVar14);
        factor::binaryOpIP<merlin::factor::binOpDivide>
                  (fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                   super__Vector_impl_data._M_start + *puVar14);
        dVar15 = ::log(vVar16);
        this->m_logz = this->m_logz + dVar15;
        Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[*puVar14] =
             dVar15 + Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[*puVar14];
        for (uVar13 = 0;
            uVar13 < ((long)alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U;
            uVar13 = uVar13 + 1) {
          graph::add_edge(this_00,(index)ftmp.
                                         super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                          alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar13]);
        }
        fVar8 = *puVar14;
        for (piVar12 = New.
                       super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[fVar8].
                       super_my_vector<unsigned_long>.
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar12 !=
            New.
            super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start[fVar8].super_my_vector<unsigned_long>.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; piVar12 = piVar12 + 1) {
          graph::add_edge(this_00,*piVar12,
                          (index)ftmp.
                                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          fVar8 = *puVar14;
        }
        this_01 = New.
                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + fVar8;
        puVar2 = Orig.
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[fVar8].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (Orig.
            super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start[fVar8].super_my_vector<unsigned_long>.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar2) {
          Orig.
          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[fVar8].super_my_vector<unsigned_long>.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar2;
          piVar12 = (this_01->super_my_vector<unsigned_long>).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        piVar3 = (this_01->super_my_vector<unsigned_long>).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar12 != piVar3) {
          (this_01->super_my_vector<unsigned_long>).
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3;
        }
        my_set<unsigned_long>::operator|=(this_01,(unsigned_long *)&ftmp);
        graphical_model::insert
                  (&this->super_graphical_model,&vin,*puVar14,
                   &fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_start[*puVar14].v_);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ids);
    }
    puVar10 = puVar10 + 1;
  }
  if (this->m_debug != false) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Finished creating the join graph.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  factor::factor(&F,0.0);
  dVar15 = extraout_XMM0_Qa;
  for (uVar13 = 0;
      uVar13 < (ulong)(((long)fin.
                              super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)fin.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x60); uVar13 = uVar13 + 1
      ) {
    log((merlin *)&local_a0,dVar15);
    factor::binaryOpIP<merlin::factor::binOpPlus>(&F,&local_a0);
    factor::~factor(&local_a0);
    dVar15 = extraout_XMM0_Qa_00;
  }
  if (F.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      F.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    vVar16 = factor::max(&F);
    this->m_logz = vVar16 + this->m_logz;
    std::operator<<((ostream *)&std::cout,"[JGLP] Finished initialization in ");
    dVar15 = timeSystem();
    poVar7 = std::ostream::_M_insert<double>(dVar15 - (this->super_algorithm).m_start_time);
    poVar7 = std::operator<<(poVar7," seconds");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[JGLP] Initial Upper Bound is ");
    *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 8) = 6;
    poVar7 = std::ostream::_M_insert<double>(this->m_logz);
    poVar7 = std::operator<<(poVar7," (");
    lVar11 = *(long *)poVar7;
    lVar4 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar7 + lVar4 + 0x18) = *(uint *)(poVar7 + lVar4 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar7 + *(long *)(lVar11 + -0x18) + 8) = 6;
    dVar15 = exp(this->m_logz);
    poVar7 = std::ostream::_M_insert<double>(dVar15);
    poVar7 = std::operator<<(poVar7,")");
    std::endl<char,std::char_traits<char>>(poVar7);
    tighten(this,this->m_num_iter,-1.0,-1.0);
    poVar7 = std::operator<<((ostream *)&std::cout,"[JGLP] Final Upper Bound is ");
    lVar11 = *(long *)poVar7;
    lVar4 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar7 + lVar4 + 0x18) = *(uint *)(poVar7 + lVar4 + 0x18) & 0xfffffefb | 4;
    *(undefined8 *)(poVar7 + *(long *)(lVar11 + -0x18) + 8) = 6;
    poVar7 = std::ostream::_M_insert<double>(this->m_logz);
    poVar7 = std::operator<<(poVar7," (");
    lVar11 = *(long *)poVar7;
    lVar4 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar7 + lVar4 + 0x18) = *(uint *)(poVar7 + lVar4 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar7 + *(long *)(lVar11 + -0x18) + 8) = 6;
    dVar15 = exp(this->m_logz);
    poVar7 = std::ostream::_M_insert<double>(dVar15);
    poVar7 = std::operator<<(poVar7,")");
    std::endl<char,std::char_traits<char>>(poVar7);
    dVar15 = graphical_model::logP(&this->m_gmo,&this->m_best_config);
    this->m_lb = dVar15;
    poVar7 = std::operator<<((ostream *)&std::cout,"[JGLP] Final Lower Bound is ");
    lVar11 = *(long *)poVar7;
    lVar4 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar7 + lVar4 + 0x18) = *(uint *)(poVar7 + lVar4 + 0x18) & 0xfffffefb | 4;
    *(undefined8 *)(poVar7 + *(long *)(lVar11 + -0x18) + 8) = 6;
    poVar7 = std::ostream::_M_insert<double>(this->m_lb);
    poVar7 = std::operator<<(poVar7," (");
    lVar11 = *(long *)poVar7;
    lVar4 = *(long *)(lVar11 + -0x18);
    *(uint *)(poVar7 + lVar4 + 0x18) = *(uint *)(poVar7 + lVar4 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar7 + *(long *)(lVar11 + -0x18) + 8) = 6;
    dVar15 = exp(this->m_lb);
    poVar7 = std::ostream::_M_insert<double>(dVar15);
    poVar7 = std::operator<<(poVar7,")");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"MAP");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar7," ");
    local_40 = &std::cout;
    local_38 = " ";
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )&local_a0,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(this->m_best_config).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
               (this->m_best_config).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    factor::~factor(&F);
    std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
    ~vector(&New);
    std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
    ~vector(&Orig);
    std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
    ~vector(&vin);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Norm.super__Vector_base<double,_std::allocator<double>_>);
    std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&fin);
    return;
  }
  __assert_fail("F.nvar() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/jglp.cpp",
                0x13d,"virtual void merlin::jglp::run()");
}

Assistant:

void jglp::run() {

	// Start the timer and store it
	m_start_time = timeSystem();

	// Initialize
	init();

	// Prepare the buckets
	std::vector<factor> fin(m_gmo.get_factors()); // get the original input factors
	std::vector<double> Norm(m_gmo.num_factors(), 0.0); // and normalize them
	for (size_t i = 0; i < m_gmo.num_factors(); ++i) {
		double mx = fin[i].max();
		fin[i] /= mx;
		Norm[i] = std::log(mx);
		m_logz += Norm[i];
	}

	// Map each variable to the list of factors mentioning that variable
	std::vector<flist> vin;
	for (size_t i = 0; i < m_gmo.nvar(); ++i) {
		vin.push_back(m_gmo.with_variable(var(i)));
	}

	// Origination info: which original factors are included for the first
	// time, and which newly created clusters feed into this cluster
	std::vector<flist> Orig(m_gmo.num_factors());
	std::vector<flist> New(m_gmo.num_factors());
	for (size_t i = 0; i < Orig.size(); ++i) {
		Orig[i] |= i;
	}

	// save the mini-buckets (as lists of factor indeces)
	m_mini_buckets.resize(m_gmo.nvar());

	// Eliminate each variable in the sequence given:
	std::cout << "[JGLP] Initialize join graph ..." << std::endl;

	for (variable_order_t::const_iterator x = m_order.begin(); x != m_order.end(); ++x) {

		if (m_debug) {
			std::cout << "  Eliminating variable " << *x << std::endl;
		}

		variable VX = var(*x);
		if (*x >= vin.size() || vin[*x].size() == 0)
			continue;  // check that we have some factors over this variable


		// list of factor IDs contained in this bucket
		flist ids = vin[*x];

		// partition into mini-buckets
		partition(VX, fin, vin, Norm, Orig, New, ids);

		// Perform any matching?
		//    "Matching" here is: compute the largest overlap of all buckets,
		//    and ensure that the
		//    moments on that subset of variables are identical in all buckets.
		if ( ids.size() > 1 ) {
			std::vector<factor> ftmp(ids.size());  // compute geometric mean
			variable_set var = fin[ids[0]].vars();      // on all mutual variables
			for (size_t i = 1; i < ids.size(); i++)
				var &= fin[ids[i]].vars();
			//Factor fmatch(var,1.0);
			factor fmatch(var, 0.0);
			for (size_t i = 0; i < ids.size(); i++) {
				//ftmp[i] = marg(fin[ids[i]],var);
				//fmatch *= ftmp[i];
				ftmp[i] = marg(fin[ids[i]], var).log();
				fmatch += ftmp[i];
			}
			//fmatch ^= (1.0/ids.size());                  // and match each bucket to it
			fmatch *= (1.0 / ids.size());     // and match each bucket to it
			//for (size_t i=0;i<ids.size();i++) fin[ids[i]] *= fmatch/ftmp[i];
			for (size_t i = 0; i < ids.size(); i++)
				fin[ids[i]] *= (fmatch - ftmp[i]).exp();
		}

		// Eliminate individually within buckets
		std::vector<findex> alphas;
		for (flistIt i = ids.begin(); i != ids.end(); ++i) {

			// Create new cluster alpha over this set of variables;
			// save function parameters also
			findex alpha = findex(-1);//, alpha2 = findex(-1);
			alpha = add_factor(fin[*i]);
			alphas.push_back(alpha);
			m_mini_buckets[*x] |= alpha;

			fin[*i] = elim(fin[*i], VX);

			m_factors[alpha] /= fin[*i];

			// normalize for numerical stability
			double maxf = fin[*i].max();
			fin[*i] /= maxf;
			maxf = std::log(maxf);
			m_logz += maxf;
			Norm[*i] += maxf; // save normalization for overall bound

			for (size_t j = 0; j < alphas.size() - 1; ++j)
				add_edge(alpha, alphas[j]);
			for (flistIt j = New[*i].begin(); j != New[*i].end(); ++j)
				add_edge(*j, alpha);

			Orig[*i].clear();
			New[*i].clear();
			New[*i] |= alpha;  // now incoming nodes to *i is just alpha

			insert(vin, *i, fin[*i].vars()); // recompute and update adjacency
		}
	}
	/// end for: variable elim order

	if (m_debug) {
		std::cout << "Finished creating the join graph." << std::endl;
	}

	// Compute the initial upper bound
	factor F(0.0);
	for (size_t i = 0; i < fin.size(); ++i)
		F += log(fin[i]);
	assert(F.nvar() == 0);
	m_logz += F.max();

	std::cout << "[JGLP] Finished initialization in " << (timeSystem() - m_start_time) << " seconds" << std::endl;
	std::cout << "[JGLP] Initial Upper Bound is "
		<< std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz)	<< ")" << std::endl;

	// Followed by iterative cost-shifting tighteing via JG propagation
	tighten(m_num_iter);

	// Output the MAP assignment
	std::cout << "[JGLP] Final Upper Bound is "
		<< std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz)	<< ")" << std::endl;

	m_lb = m_gmo.logP(m_best_config);
	std::cout << "[JGLP] Final Lower Bound is "
		<< std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_lb << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_lb) << ")" << std::endl;

	std::cout << "MAP" << std::endl;
	std::cout << m_best_config.size() << " ";
	std::copy(m_best_config.begin(), m_best_config.end(),
			std::ostream_iterator<index>(std::cout, " "));
	std::cout << std::endl;
}